

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_60(QPDF *pdf,char *arg2)

{
  int iVar1;
  bool bVar2;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle QVar4;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle QVar6;
  QPDFObjectHandle QVar7;
  allocator<char> local_161;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158 [3];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  conflicts;
  QPDFObjectHandle r3;
  QPDFObjectHandle r2;
  anon_class_8_1_ba1d6c52 make_resource;
  QPDFObjectHandle trailer;
  QPDFObjectHandle r1;
  QPDFObjectHandle y;
  anon_class_8_1_e5d0d581 show_conflicts;
  int min_suffix;
  QPDFObjectHandle z;
  undefined1 local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  undefined1 local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  QPDFObjectHandle::newDictionary();
  iVar1 = 2;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Quack",(allocator<char> *)&z);
    QPDFObjectHandle::getUniqueResourceName((string *)&conflicts,(int *)&r1,(set *)&w);
    std::__cxx11::string::~string((string *)&w);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&w,"<< /Z << >> >>",(allocator<char> *)&y);
    std::__cxx11::string::string<std::allocator<char>>((string *)&z,"",(allocator<char> *)&r2);
    QPDFObjectHandle::parse((string *)local_40,(string *)&w);
    QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40;
    QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&r1;
    QPDFObjectHandle::mergeResources(QVar3,(map *)0x0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::__cxx11::string::~string((string *)&z);
    std::__cxx11::string::~string((string *)&w);
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Z",(allocator<char> *)&r3);
    QPDFObjectHandle::getKey((string *)&y);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&z,"moo",(allocator<char> *)&trailer);
    QPDFObjectHandle::newString((string *)&r2);
    QPDFObjectHandle::replaceKey((string *)&y,(QPDFObjectHandle *)&conflicts);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&r2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&z);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&y.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&w);
    std::__cxx11::string::~string((string *)&conflicts);
  }
  make_resource.pdf = pdf;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/Z",(allocator<char> *)&w);
  QPDFObjectHandle::getKey((string *)&z);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/Y",(allocator<char> *)&y);
  QPDFObjectHandle::newDictionary();
  QPDFObjectHandle::replaceKey((string *)&r1,(QPDFObjectHandle *)&conflicts);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_158);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/Y",(allocator<char> *)&w);
  QPDFObjectHandle::getKey((string *)&y);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/F1",(allocator<char> *)&r2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"r1.Z.F1",(allocator<char> *)&r3);
  test_60::anon_class_8_1_ba1d6c52::operator()(&make_resource,&z,(string *)&conflicts,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/F2",(allocator<char> *)&r2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"r1.Z.F2",(allocator<char> *)&r3);
  test_60::anon_class_8_1_ba1d6c52::operator()(&make_resource,&z,(string *)&conflicts,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/F2",(allocator<char> *)&r2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"r1.Y.F2",(allocator<char> *)&r3);
  test_60::anon_class_8_1_ba1d6c52::operator()(&make_resource,&y,(string *)&conflicts,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/F3",(allocator<char> *)&r2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"r1.Y.F3",(allocator<char> *)&r3);
  test_60::anon_class_8_1_ba1d6c52::operator()(&make_resource,&y,(string *)&conflicts,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"<< /Z << >> /Y << >> >>",(allocator<char> *)&r3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"",(allocator<char> *)&trailer);
  QPDFObjectHandle::parse((string *)&r2,(string *)&conflicts);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/Z",(allocator<char> *)&r3);
  QPDFObjectHandle::getKey((string *)&w);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&z,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_158);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/Y",(allocator<char> *)&r3);
  QPDFObjectHandle::getKey((string *)&w);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&y,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_158);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/F2",(allocator<char> *)&r3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"r2.Z.F2",(allocator<char> *)&trailer);
  test_60::anon_class_8_1_ba1d6c52::operator()(&make_resource,&z,(string *)&conflicts,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/F3",(allocator<char> *)&r3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"r2.Y.F3",(allocator<char> *)&trailer);
  test_60::anon_class_8_1_ba1d6c52::operator()(&make_resource,&y,(string *)&conflicts,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/F4",(allocator<char> *)&r3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"r2.Y.F4",(allocator<char> *)&trailer);
  test_60::anon_class_8_1_ba1d6c52::operator()(&make_resource,&y,(string *)&conflicts,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&conflicts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&conflicts,"/F5",(allocator<char> *)&trailer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"direct r2.Y.F5",(allocator<char> *)&show_conflicts);
  QPDFObjectHandle::newString((string *)&r3);
  QPDFObjectHandle::replaceKey((string *)&y,(QPDFObjectHandle *)&conflicts);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::~string((string *)&conflicts);
  conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &conflicts._M_t._M_impl.super__Rb_tree_header._M_header;
  conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  conflicts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       conflicts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  show_conflicts.conflicts = &conflicts;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_50,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&r2);
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&r1;
  QPDFObjectHandle::mergeResources(QVar4,(map *)&conflicts);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"first merge",(allocator<char> *)&r3);
  test_60::anon_class_8_1_e5d0d581::operator()(&show_conflicts,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  QPDFObjectHandle::shallowCopy();
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_60,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&r2);
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&r1;
  QPDFObjectHandle::mergeResources(QVar5,(map *)&conflicts);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"second merge",(allocator<char> *)&trailer);
  test_60::anon_class_8_1_e5d0d581::operator()(&show_conflicts,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  QPDFObjectHandle::makeResourcesIndirect((QPDF *)&r2);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_70,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&r2);
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&r1;
  QPDFObjectHandle::mergeResources(QVar6,(map *)&conflicts);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"third merge",(allocator<char> *)&trailer);
  test_60::anon_class_8_1_e5d0d581::operator()(&show_conflicts,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_80,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&r2);
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&r1;
  QPDFObjectHandle::mergeResources(QVar7,(map *)&conflicts);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"fourth merge",(allocator<char> *)&trailer);
  test_60::anon_class_8_1_e5d0d581::operator()(&show_conflicts,(string *)&w);
  std::__cxx11::string::~string((string *)&w);
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/QTest1",&local_161);
  QPDFObjectHandle::replaceKey((string *)&trailer,(QPDFObjectHandle *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/QTest2",&local_161);
  QPDFObjectHandle::replaceKey((string *)&trailer,(QPDFObjectHandle *)&w);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/QTest3",&local_161);
  QPDFObjectHandle::replaceKey((string *)&trailer,(QPDFObjectHandle *)&w);
  std::__cxx11::string::~string((string *)&w);
  QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
  QPDFWriter::setQDFMode(SUB81(&w,0));
  QPDFWriter::setStaticID(SUB81(&w,0));
  QPDFWriter::write();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&trailer.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~_Rb_tree(&conflicts._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&y.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&z.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&r1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

static void
test_60(QPDF& pdf, char const* arg2)
{
    // Boundary condition testing for getUniqueResourceName;
    // additional testing of mergeResources with conflict
    // detection
    QPDFObjectHandle r1 = QPDFObjectHandle::newDictionary();
    int min_suffix = 1;
    for (int i = 1; i < 3; ++i) {
        std::string name = r1.getUniqueResourceName("/Quack", min_suffix);
        r1.mergeResources(QPDFObjectHandle::parse("<< /Z << >> >>"));
        r1.getKey("/Z").replaceKey(name, QPDFObjectHandle::newString("moo"));
    }
    auto make_resource =
        [&](QPDFObjectHandle& dict, std::string const& key, std::string const& str) {
            auto o1 = QPDFObjectHandle::newArray();
            o1.appendItem(QPDFObjectHandle::newString(str));
            dict.replaceKey(key, pdf.makeIndirectObject(o1));
        };

    auto z = r1.getKey("/Z");
    r1.replaceKey("/Y", QPDFObjectHandle::newDictionary());
    auto y = r1.getKey("/Y");
    make_resource(z, "/F1", "r1.Z.F1");
    make_resource(z, "/F2", "r1.Z.F2");
    make_resource(y, "/F2", "r1.Y.F2");
    make_resource(y, "/F3", "r1.Y.F3");
    QPDFObjectHandle r2 = QPDFObjectHandle::parse("<< /Z << >> /Y << >> >>");
    z = r2.getKey("/Z");
    y = r2.getKey("/Y");
    make_resource(z, "/F2", "r2.Z.F2");
    make_resource(y, "/F3", "r2.Y.F3");
    make_resource(y, "/F4", "r2.Y.F4");
    // Add a direct object
    y.replaceKey("/F5", QPDFObjectHandle::newString("direct r2.Y.F5"));

    std::map<std::string, std::map<std::string, std::string>> conflicts;
    auto show_conflicts = [&](std::string const& msg) {
        std::cout << msg << std::endl;
        for (auto const& i1: conflicts) {
            std::cout << i1.first << ":" << std::endl;
            for (auto const& i2: i1.second) {
                std::cout << "  " << i2.first << " -> " << i2.second << std::endl;
            }
        }
    };

    r1.mergeResources(r2, &conflicts);
    show_conflicts("first merge");
    auto r3 = r1.shallowCopy();
    // Merge again. The direct object gets recopied. Everything
    // else is the same.
    r1.mergeResources(r2, &conflicts);
    show_conflicts("second merge");

    // Make all resources in r2 direct. Then merge two more times.
    // We should get the one previously direct object copied one
    // time as an indirect object.
    r2.makeResourcesIndirect(pdf);
    r1.mergeResources(r2, &conflicts);
    show_conflicts("third merge");
    r1.mergeResources(r2, &conflicts);
    show_conflicts("fourth merge");

    // The only differences between /QTest and /QTest3 should be
    // the direct objects merged from r2.
    auto trailer = pdf.getTrailer();
    trailer.replaceKey("/QTest1", r1);
    trailer.replaceKey("/QTest2", r2);
    trailer.replaceKey("/QTest3", r3);
    QPDFWriter w(pdf, "a.pdf");
    w.setQDFMode(true);
    w.setStaticID(true);
    w.write();
}